

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solverational.hpp
# Opt level: O0

void __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::_updateReducedCosts
          (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,SolRational *sol,int *dualSize,int *numCorrectedPrimals)

{
  int iVar1;
  Verbosity VVar2;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *in_RCX;
  int *in_RDX;
  long in_RSI;
  char *in_RDI;
  Verbosity old_verbosity;
  int numCorrectedDuals;
  undefined4 in_stack_ffffffffffffffd0;
  Verbosity in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  
  iVar1 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          ::size((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  *)(in_RDI + 0x59e8));
  if (iVar1 < *in_RDX + 1) {
    (**(code **)(**(long **)(in_RDI + 0x52e0) + 0x248))
              (*(long **)(in_RDI + 0x52e0),in_RDI + 0x59e8,in_RSI + 0x60);
  }
  else {
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::getObj(in_RCX,(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                     *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    (**(code **)(**(long **)(in_RDI + 0x52e0) + 0x250))
              (*(long **)(in_RDI + 0x52e0),in_RSI + 0x48,in_RSI + 0x60);
  }
  iVar1 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          ::size((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  *)(in_RDI + 0x59e8));
  if (((0 < *(int *)&(in_RCX->
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                     ).
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                     .
                     super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                     ._vptr_ClassArray + iVar1) && (in_RDI != (char *)0xfffffffffffffff8)) &&
     (VVar2 = SPxOut::getVerbosity((SPxOut *)(in_RDI + 8)), 3 < (int)VVar2)) {
    SPxOut::getVerbosity((SPxOut *)(in_RDI + 8));
    VVar2 = INFO2;
    SPxOut::setVerbosity((SPxOut *)(in_RDI + 8),(Verbosity *)&stack0xffffffffffffffd4);
    soplex::operator<<((SPxOut *)CONCAT44(VVar2,in_stack_ffffffffffffffd0),in_RDI);
    soplex::operator<<((SPxOut *)CONCAT44(VVar2,in_stack_ffffffffffffffd0),
                       (int)((ulong)in_RDI >> 0x20));
    soplex::operator<<((SPxOut *)CONCAT44(VVar2,in_stack_ffffffffffffffd0),in_RDI);
    soplex::operator<<((SPxOut *)CONCAT44(VVar2,in_stack_ffffffffffffffd0),
                       (int)((ulong)in_RDI >> 0x20));
    soplex::operator<<((SPxOut *)CONCAT44(VVar2,in_stack_ffffffffffffffd0),in_RDI);
    SPxOut::setVerbosity((SPxOut *)(in_RDI + 8),(Verbosity *)&stack0xffffffffffffffd8);
  }
  return;
}

Assistant:

void SoPlexBase<R>::_updateReducedCosts(SolRational& sol, int& dualSize,
                                        const int& numCorrectedPrimals)
{

   if(_primalDualDiff.size() < dualSize + 1)
   {
      _rationalLP->addDualActivity(_primalDualDiff, sol._redCost);
#ifndef NDEBUG
      {
         VectorRational activity(_rationalLP->maxObj());
         activity *= -1;
         _rationalLP->subDualActivity(sol._dual, activity);
      }
#endif
   }
   else
   {
      // we assume that the objective function vector has less nonzeros than the reduced cost vector, and so multiplying
      // with -1 first and subtracting the dual activity should be faster than adding the dual activity and negating
      // afterwards
      _rationalLP->getObj(sol._redCost);
      _rationalLP->subDualActivity(sol._dual, sol._redCost);
   }

   const int numCorrectedDuals = _primalDualDiff.size();

   if(numCorrectedPrimals + numCorrectedDuals > 0)
   {
      SPX_MSG_INFO2(spxout, spxout << "Corrected " << numCorrectedPrimals << " primal variables and " <<
                    numCorrectedDuals << " dual values.\n");
   }
}